

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Bool CopyAttrs(TidyDocImpl *doc,Node *node,Node *child)

{
  TidyAttrId id;
  AttVal *pAVar1;
  AttVal *pAVar2;
  
  pAVar1 = prvTidyAttrGetById(child,TidyAttr_ID);
  if ((pAVar1 != (AttVal *)0x0) &&
     (pAVar1 = prvTidyAttrGetById(node,TidyAttr_ID), pAVar1 != (AttVal *)0x0)) {
    return no;
  }
  pAVar1 = child->attributes;
  do {
    while( true ) {
      if (pAVar1 == (AttVal *)0x0) {
        return yes;
      }
      if ((pAVar1->dict != (Attribute *)0x0) && (id = pAVar1->dict->id, id != TidyAttr_UNKNOWN))
      break;
LAB_0014dfdf:
      prvTidyDetachAttribute(child,pAVar1);
      pAVar2 = pAVar1->next;
      pAVar1->next = (AttVal *)0x0;
      prvTidyInsertAttributeAtEnd(node,pAVar1);
      pAVar1 = pAVar2;
    }
    if ((id != TidyAttr_STYLE) && (id != TidyAttr_CLASS)) {
      pAVar2 = prvTidyAttrGetById(node,id);
      if (pAVar2 != (AttVal *)0x0) {
        prvTidyRemoveAttribute(doc,node,pAVar2);
      }
      goto LAB_0014dfdf;
    }
    pAVar1 = pAVar1->next;
  } while( true );
}

Assistant:

static Bool CopyAttrs( TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av1, *av2;
    TidyAttrId id;

    /* Detect attributes that cannot be merged or overwritten. */
    if (TY_(AttrGetById)(child, TidyAttr_ID) != NULL
        && TY_(AttrGetById)(node, TidyAttr_ID) != NULL)
        return no;

    /* Move child attributes to node. Attributes in node
     can be overwritten or merged. */
    for (av2 = child->attributes; av2; )
    {
        /* Dealt by MergeStyles. */
        if (attrIsSTYLE(av2) || attrIsCLASS(av2))
        {
            av2 = av2->next;
            continue;
        }
        /* Avoid duplicates in node */
        if ((id=AttrId(av2)) != TidyAttr_UNKNOWN
            && (av1=TY_(AttrGetById)(node, id))!= NULL)
            TY_(RemoveAttribute)( doc, node, av1 );

        /* Move attribute from child to node */
        TY_(DetachAttribute)( child, av2 );
        av1 = av2;
        av2 = av2->next;
        av1->next = NULL;
        TY_(InsertAttributeAtEnd)( node, av1 );
    }

    return yes;
}